

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

void __thiscall cmQtAutoGenerator::Logger::Logger(Logger *this)

{
  bool bVar1;
  ulong uVar2;
  string_view sVar3;
  undefined1 local_78 [8];
  string colorEnv;
  unsigned_long local_48;
  unsigned_long iVerbose;
  undefined1 local_30 [8];
  string verbose;
  Logger *this_local;
  
  verbose.field_2._8_8_ = this;
  std::mutex::mutex(&this->Mutex_);
  this->Verbosity_ = 0;
  this->ColorOutput_ = false;
  std::__cxx11::string::string((string *)local_30);
  bVar1 = cmsys::SystemTools::GetEnv("VERBOSE",(string *)local_30);
  if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    local_48 = 0;
    bVar1 = cmStrToULong((string *)local_30,&local_48);
    if (bVar1) {
      SetVerbosity(this,(uint)local_48);
    }
    else {
      sVar3 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
      colorEnv.field_2._8_8_ = sVar3._M_len;
      bVar1 = cmIsOn(sVar3);
      SetVerbose(this,bVar1);
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::string((string *)local_78);
  cmsys::SystemTools::GetEnv("COLOR",(string *)local_78);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
    bVar1 = cmIsOn(sVar3);
    SetColorOutput(this,bVar1);
  }
  else {
    SetColorOutput(this,true);
  }
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

cmQtAutoGenerator::Logger::Logger()
{
  // Initialize logger
  {
    std::string verbose;
    if (cmSystemTools::GetEnv("VERBOSE", verbose) && !verbose.empty()) {
      unsigned long iVerbose = 0;
      if (cmStrToULong(verbose, &iVerbose)) {
        this->SetVerbosity(static_cast<unsigned int>(iVerbose));
      } else {
        // Non numeric verbosity
        this->SetVerbose(cmIsOn(verbose));
      }
    }
  }
  {
    std::string colorEnv;
    cmSystemTools::GetEnv("COLOR", colorEnv);
    if (!colorEnv.empty()) {
      this->SetColorOutput(cmIsOn(colorEnv));
    } else {
      this->SetColorOutput(true);
    }
  }
}